

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O0

void Cffpknl(fitsfile *fptr,char *keyroot,int nstart,int nkeys,int *numval,char **comment,
            int *status)

{
  int local_34;
  int i;
  char **comment_local;
  int *numval_local;
  int nkeys_local;
  int nstart_local;
  char *keyroot_local;
  fitsfile *fptr_local;
  
  for (local_34 = 0; local_34 < nkeys; local_34 = local_34 + 1) {
    numval[local_34] = numval[local_34];
  }
  ffpknl(fptr,keyroot,nstart,nkeys,numval,comment,status);
  for (local_34 = 0; local_34 < nkeys; local_34 = local_34 + 1) {
    numval[local_34] = (uint)(numval[local_34] != 0);
  }
  return;
}

Assistant:

void Cffpknl( fitsfile *fptr, char *keyroot, int nstart, int nkeys,
              int *numval, char **comment, int *status )
{
   int i;
 
   for( i=0; i<nkeys; i++ )
      numval[i] = F2CLOGICAL(numval[i]);
   ffpknl( fptr, keyroot, nstart, nkeys, numval, comment, status );
   for( i=0; i<nkeys; i++ )
      numval[i] = C2FLOGICAL(numval[i]);
}